

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O0

Type ag::VariantToType(agvariant *v)

{
  char *pcVar1;
  int in_EDX;
  char *in_RSI;
  agvariant *v_local;
  
  pcVar1 = std::
           variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::index(v,in_RSI,in_EDX);
  switch(pcVar1) {
  case (char *)0x0:
    v_local._4_4_ = Char;
    break;
  case (char *)0x1:
    v_local._4_4_ = UInt;
    break;
  case (char *)0x2:
    v_local._4_4_ = Int;
    break;
  case (char *)0x3:
    v_local._4_4_ = Float;
    break;
  case (char *)0x4:
    v_local._4_4_ = String;
    break;
  default:
    v_local._4_4_ = Void;
  }
  return v_local._4_4_;
}

Assistant:

inline Type VariantToType(agvariant v) {
		switch (v.index()) {
		case 0: return Type::Char;
		case 1: return Type::UInt;
		case 2: return Type::Int;
		case 3: return Type::Float;
		case 4: return Type::String;
		default: return Type::Void;
		}
	}